

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Refal2::CScanner::processingInitial(CScanner *this,char c)

{
  int iVar1;
  CDirectiveParser *pCVar2;
  bool bVar3;
  TError error;
  undefined7 in_register_00000031;
  TTokenType TStack_20;
  
  iVar1 = (int)CONCAT71(in_register_00000031,c);
  switch(iVar1) {
  case 0x28:
    TStack_20 = TT_LeftParen;
    break;
  case 0x29:
    TStack_20 = TT_RightParen;
    break;
  case 0x2c:
    TStack_20 = TT_Comma;
    break;
  case 0x2d:
    error = E_UnexpectedCharacter;
    c = '-';
    goto LAB_00134a38;
  case 0x2e:
  case 0x3e:
    std::__cxx11::string::operator=
              ((string *)
               &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                super_CQualifierParser.token.word,c);
    TStack_20 = TT_RightBracket;
    break;
  case 0x2f:
    iVar1 = this->position;
    pCVar2 = &(this->super_CParser).super_CDirectiveParser;
    (pCVar2->super_CRuleParser).super_CQualifierParser.token.line = this->line;
    (pCVar2->super_CRuleParser).super_CQualifierParser.token.position = iVar1;
    this->state = S_Symbol;
    return;
  case 0x3a:
    iVar1 = this->position;
    pCVar2 = &(this->super_CParser).super_CDirectiveParser;
    (pCVar2->super_CRuleParser).super_CQualifierParser.token.line = this->line;
    (pCVar2->super_CRuleParser).super_CQualifierParser.token.position = iVar1;
    this->state = S_BeginOfQualifier;
    return;
  case 0x3c:
    TStack_20 = TT_LeftBracket;
    break;
  case 0x3d:
    TStack_20 = TT_Equal;
    break;
  default:
    if (iVar1 == 0) {
      return;
    }
    if (iVar1 == 9) {
LAB_00134970:
      iVar1 = this->position;
      pCVar2 = &(this->super_CParser).super_CDirectiveParser;
      (pCVar2->super_CRuleParser).super_CQualifierParser.token.line = this->line;
      (pCVar2->super_CRuleParser).super_CQualifierParser.token.position = iVar1;
      this->state = S_Blank;
      return;
    }
    if (iVar1 == 10) {
      TStack_20 = TT_LineFeed;
      break;
    }
    if (iVar1 == 0x20) goto LAB_00134970;
  case 0x2a:
  case 0x2b:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3b:
    bVar3 = IsWordLetter(c);
    if (bVar3) {
      std::__cxx11::string::operator=
                ((string *)
                 &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                  super_CQualifierParser.token.word,c);
      iVar1 = this->position;
      pCVar2 = &(this->super_CParser).super_CDirectiveParser;
      (pCVar2->super_CRuleParser).super_CQualifierParser.token.line = this->line;
      (pCVar2->super_CRuleParser).super_CQualifierParser.token.position = iVar1;
      this->state = S_Word;
      return;
    }
    error = E_InvalidCharacter;
LAB_00134a38:
    CScanner::error(this,error,c);
    return;
  }
  addTokenWithCurrentLineAndPosition(this,TStack_20);
  return;
}

Assistant:

void CScanner::processingInitial( char c )
{
	switch( c ) {
		case Comma:
			addTokenWithCurrentLineAndPosition( TT_Comma );
			break;
		case Equal:
			addTokenWithCurrentLineAndPosition( TT_Equal );
			break;
		case LineFeed:
			addTokenWithCurrentLineAndPosition( TT_LineFeed );
			break;
		case LeftParen:
			addTokenWithCurrentLineAndPosition( TT_LeftParen );
			break;
		case RightParen:
			addTokenWithCurrentLineAndPosition( TT_RightParen );
			break;
		case LeftBracket:
			addTokenWithCurrentLineAndPosition( TT_LeftBracket );
			break;
		case Dot:
		case RightBracket:
			token.word = c;
			addTokenWithCurrentLineAndPosition( TT_RightBracket );
			break;
		case LimiterOfSymbol:
			setLineAndPositionOfToken();
			state = S_Symbol;
			break;
		case LimiterOfQualifier:
			setLineAndPositionOfToken();
			state = S_BeginOfQualifier;
			break;
		case UniversalSeparatorOfTokens:
			break;
		default:
			if( IsSpace( c ) ) {
				setLineAndPositionOfToken();
				state = S_Blank;
			} else if( c == Hyphen ) {
				error( E_UnexpectedCharacter, c );
			} else if( IsWordLetter( c ) ) {
				token.word = c;
				setLineAndPositionOfToken();
				state = S_Word;
			} else {
				error( E_InvalidCharacter, c );
			}
			break;
	}
}